

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O1

void __thiscall duckdb::KeyValueSecret::Serialize(KeyValueSecret *this,Serializer *serializer)

{
  Serializer *this_00;
  _Base_ptr p_Var1;
  LogicalType *child_type;
  _Hash_node_base *p_Var2;
  vector<duckdb::Value,_true> redact_key_values;
  _Self __tmp;
  vector<duckdb::Value,_true> map_values;
  Value list;
  Value map;
  LogicalType map_type;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_238;
  _Base_ptr local_220;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_218;
  KeyValueSecret *local_200;
  Serializer *local_1f8;
  _Base_ptr local_1f0;
  LogicalType local_1e8;
  string local_1d0;
  char *local_1b0;
  Value local_1a8;
  vector<duckdb::Value,_true> local_168;
  vector<duckdb::Value,_true> local_150;
  LogicalType local_138;
  LogicalType local_120;
  string local_108;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_e8;
  Value local_88;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_48;
  
  local_1f8 = serializer;
  BaseSecret::SerializeBaseSecret(&this->super_BaseSecret,serializer);
  local_218.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1f0 = &(this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_200 = this;
  if (p_Var1 != local_1f0) {
    do {
      local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      local_220 = p_Var1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,*(long *)(p_Var1 + 1),
                 (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
      Value::Value(&local_88,&local_1d0);
      local_1b0 = "key";
      Value::Value(&local_1a8,&local_88);
      ::std::__cxx11::string::string((string *)&local_e8,local_1b0,(allocator *)&local_1e8);
      Value::Value(&local_e8.second,&local_1a8);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                  *)&local_238,&local_e8);
      Value::~Value(&local_e8.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
        operator_delete(local_e8.first._M_dataplus._M_p);
      }
      Value::~Value(&local_1a8);
      Value::~Value(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      Value::Value(&local_88,(Value *)(local_220 + 2));
      local_1b0 = "value";
      Value::Value(&local_1a8,&local_88);
      ::std::__cxx11::string::string((string *)&local_e8,local_1b0,(allocator *)&local_1e8);
      Value::Value(&local_e8.second,&local_1a8);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                  *)&local_238,&local_e8);
      Value::~Value(&local_e8.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
        operator_delete(local_e8.first._M_dataplus._M_p);
      }
      Value::~Value(&local_1a8);
      Value::~Value(&local_88);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::vector(&local_48,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)&local_238);
      Value::STRUCT((Value *)&local_e8,(child_list_t<Value> *)&local_48);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_218,
                 (Value *)&local_e8);
      Value::~Value((Value *)&local_e8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_48);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)&local_238);
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(local_220);
    } while (p_Var1 != local_1f0);
  }
  LogicalType::LogicalType(&local_120,VARCHAR);
  LogicalType::LogicalType(&local_138,ANY);
  LogicalType::MAP(&local_88.type_,&local_120,&local_138);
  LogicalType::~LogicalType(&local_138);
  LogicalType::~LogicalType(&local_120);
  child_type = ListType::GetChildType(&local_88.type_);
  this_00 = local_1f8;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_150,&local_218);
  Value::MAP((Value *)&local_e8,child_type,&local_150);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_150);
  Serializer::WriteProperty<duckdb::Value>(this_00,0xc9,"secret_map",(Value *)&local_e8);
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = (local_200->redact_keys)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,p_Var2[1]._M_nxt,
                 (long)&(p_Var2[1]._M_nxt)->_M_nxt + (long)&(p_Var2[2]._M_nxt)->_M_nxt);
      Value::Value((Value *)&local_1b0,&local_108);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_238,
                 (Value *)&local_1b0);
      Value::~Value((Value *)&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  LogicalType::LogicalType(&local_1e8,VARCHAR);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_168,&local_238);
  Value::LIST((Value *)&local_1b0,&local_1e8,&local_168);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_168);
  LogicalType::~LogicalType(&local_1e8);
  Serializer::WriteProperty<duckdb::Value>(this_00,0xca,"redact_keys",(Value *)&local_1b0);
  Value::~Value((Value *)&local_1b0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_238);
  Value::~Value((Value *)&local_e8);
  LogicalType::~LogicalType(&local_88.type_);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_218);
  return;
}

Assistant:

void KeyValueSecret::Serialize(Serializer &serializer) const {
	BaseSecret::SerializeBaseSecret(serializer);

	vector<Value> map_values;
	for (auto it = secret_map.begin(); it != secret_map.end(); it++) {
		child_list_t<Value> map_struct;
		map_struct.push_back(make_pair("key", Value(it->first)));
		map_struct.push_back(make_pair("value", Value(it->second)));
		map_values.push_back(Value::STRUCT(map_struct));
	}

	// Warning: the secret map is serialized into a single MAP value with type ANY
	auto map_type = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::ANY);
	auto map = Value::MAP(ListType::GetChildType(map_type), map_values);
	serializer.WriteProperty(201, "secret_map", map);

	vector<Value> redact_key_values;
	for (auto it = redact_keys.begin(); it != redact_keys.end(); it++) {
		redact_key_values.push_back(*it);
	}
	auto list = Value::LIST(LogicalType::VARCHAR, redact_key_values);
	serializer.WriteProperty(202, "redact_keys", list);
}